

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

void generateData(char *dataDir,char *bundleName)

{
  undefined8 *puVar1;
  uint16_t *puVar2;
  FILE *__stream;
  UBool UVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  size_t sVar8;
  UHashElement *pUVar9;
  UNewDataMemory *pData;
  int16_t iVar10;
  int32_t count;
  ulong uVar11;
  char *pcVar12;
  char *comment;
  ushort uVar13;
  ulong uVar14;
  ulong uVar15;
  UErrorCode errorCode;
  int32_t local_5c;
  int32_t local_58;
  int32_t local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  ulong local_38;
  
  errorCode = U_ZERO_ERROR;
  local_40 = dataDir;
  sVar8 = strlen(bundleName);
  local_48 = (char *)uprv_malloc_63(sVar8 + 100);
  local_58 = -1;
  if (hashTable == (UHashtable *)0x0) {
LAB_0010a2e5:
    uVar6 = utrie_serialize_63(sprepTrie,generateData::sprepTrieBlock,100000,getFoldedValue,'\x01',
                               &errorCode);
    __stream = _stderr;
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar5 = uVar6 + 0x40 + mappingDataCapacity * 2;
      if (beVerbose != '\0') {
        printf("size of sprep trie              %5u bytes\n",(ulong)uVar6);
        printf("size of icudt63l_%s.spp contents: %ld bytes\n",bundleName,(long)(int)uVar5);
        printf("size of mapping data array %5u bytes\n",(ulong)(uint)(mappingDataCapacity * 2));
        printf("Number of code units in mappingData (currentIndex) are: %i \n",
               (ulong)(uint)(int)currentIndex);
        printf("Maximum length of the mapping string is : %i \n",(ulong)(uint)maxLength);
      }
      pcVar12 = local_48;
      *local_48 = '\0';
      strcat(local_48,bundleName);
      comment = (char *)0x0;
      if (haveCopyright != '\0') {
        comment = 
        " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
        ;
      }
      pData = udata_create(local_40,"spp",pcVar12,&dataInfo,comment,&errorCode);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        indexes[1] = mappingDataCapacity * 2;
        indexes[0] = uVar6;
        udata_writeBlock(pData,indexes,0x40);
        udata_writeBlock(pData,generateData::sprepTrieBlock,uVar6);
        udata_writeBlock(pData,mappingData,indexes[1]);
        uVar7 = udata_finish(pData,&errorCode);
        if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if (uVar7 == uVar5) {
            if (hashTable != (UHashtable *)0x0) {
              uhash_close_63(hashTable);
            }
            uprv_free_63(local_48);
            return;
          }
          fprintf(_stderr,"gensprep error: data length %ld != calculated size %ld\n",
                  (long)(int)uVar7,(long)(int)uVar5);
LAB_0010a51e:
          iVar4 = 5;
LAB_0010a53f:
          exit(iVar4);
        }
        pcVar12 = "gensprep: error %d writing the output file\n";
      }
      else {
        pcVar12 = "gensprep: unable to create the output file, error %d\n";
      }
      fprintf(_stderr,pcVar12);
    }
    else {
      pcVar12 = u_errorName_63(errorCode);
      fprintf(__stream,"error: utrie_serialize(sprep trie) failed, %s\n",pcVar12);
    }
    exit(errorCode);
  }
  local_50 = bundleName;
  local_54 = uhash_count_63(hashTable);
  mappingData = (uint16_t *)uprv_calloc_63((long)mappingDataCapacity,2);
  uVar11 = 0;
  uVar14 = 1;
  uVar15 = 0;
  local_5c = 0;
LAB_0010a16f:
  if ((int)uVar11 < local_54) {
LAB_0010a179:
    do {
      pUVar9 = uhash_nextElement_63(hashTable,&local_58);
      if (pUVar9 == (UHashElement *)0x0) goto LAB_0010a2b3;
      uVar6 = (pUVar9->key).integer;
      puVar1 = (undefined8 *)(pUVar9->value).pointer;
      if (uVar14 != uVar15) {
        if ((int)uVar15 < 4) {
          iVar4 = (int)currentIndex;
          indexes[uVar14 + 2] = iVar4;
          if (uVar14 == 4) {
            local_5c = iVar4;
          }
        }
        uVar15 = uVar14 & 0xffffffff;
      }
      iVar10 = currentIndex;
      if (uVar14 == (uint)(int)*(short *)(puVar1 + 1)) {
        uVar13 = currentIndex * 4 + 2;
        local_38 = uVar11;
        if (0xfff0 < uVar13) {
          fprintf(_stderr,"trieWord cannot contain value greater than 0x%04X.\n",0xfff0);
          iVar4 = 0xc;
          goto LAB_0010a53f;
        }
        uVar5 = utrie_get32_63(sprepTrie,uVar6,(UBool *)0x0);
        if (uVar5 == 0) {
LAB_0010a21b:
          UVar3 = utrie_set32_63(sprepTrie,uVar6,(uint)uVar13);
          puVar2 = mappingData;
          if (UVar3 != '\0') {
            iVar4 = (int)currentIndex;
            count = (int32_t)*(short *)(puVar1 + 1);
            uVar6 = count + iVar4;
            if (0x3fbe < (int)uVar6) {
              fprintf(_stderr,"Too many entries in the mapping table %i. Maximum allowed is %i\n",
                      (ulong)uVar6,0x3fbf);
              iVar4 = 8;
              goto LAB_0010a53f;
            }
            iVar10 = currentIndex;
            if (3 < uVar14) {
              iVar10 = currentIndex + 1;
              currentIndex = iVar10;
              mappingData[iVar4] = (uint16_t)uVar14;
              count = (int32_t)*(short *)(puVar1 + 1);
            }
            uVar11 = (ulong)((int)local_38 + 1);
            u_memmove_63((UChar *)(puVar2 + iVar10),(UChar *)*puVar1,count);
            currentIndex = currentIndex + *(short *)(puVar1 + 1);
            if (mappingDataCapacity < currentIndex) {
              fprintf(_stderr,"gensprep, fatal error at %s, %d.  Aborting.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hunter-packages[P]icu/source/tools/gensprep/store.c"
                      ,0x14f);
              goto LAB_0010a51e;
            }
            goto LAB_0010a179;
          }
          fwrite("Could not set the value for code point.\n",0x28,1,_stderr);
        }
        else {
          if (uVar5 == 0xfff2) {
            uVar13 = iVar10 << 2 | 3;
            goto LAB_0010a21b;
          }
          fprintf(_stderr,"Type for codepoint \\U%08X already set!.\n",(ulong)uVar6);
        }
        iVar4 = 1;
        goto LAB_0010a53f;
      }
    } while( true );
  }
  bundleName = local_50;
  if (uVar14 < 4) {
    indexes[uVar14 + 2] = currentIndex + 1;
  }
  else {
    indexes[6] = local_5c;
  }
  goto LAB_0010a2e5;
LAB_0010a2b3:
  uVar14 = uVar14 + 1;
  local_58 = -1;
  goto LAB_0010a16f;
}

Assistant:

extern void
generateData(const char *dataDir, const char* bundleName) {
    static uint8_t sprepTrieBlock[100000];

    UNewDataMemory *pData;
    UErrorCode errorCode=U_ZERO_ERROR;
    int32_t size, dataLength;
    char* fileName = (char*) uprv_malloc(uprv_strlen(bundleName) +100);

#if UCONFIG_NO_IDNA

    size=0;

#else

    int32_t sprepTrieSize;

    /* sort and add mapping data */
    storeMappingData();
    
    sprepTrieSize=utrie_serialize(sprepTrie, sprepTrieBlock, sizeof(sprepTrieBlock), getFoldedValue, TRUE, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "error: utrie_serialize(sprep trie) failed, %s\n", u_errorName(errorCode));
        exit(errorCode);
    }
    
    size = sprepTrieSize + mappingDataCapacity*U_SIZEOF_UCHAR + sizeof(indexes);
    if(beVerbose) {
        printf("size of sprep trie              %5u bytes\n", (int)sprepTrieSize);
        printf("size of " U_ICUDATA_NAME "_%s." DATA_TYPE " contents: %ld bytes\n", bundleName,(long)size);
        printf("size of mapping data array %5u bytes\n",(int)mappingDataCapacity * U_SIZEOF_UCHAR);
        printf("Number of code units in mappingData (currentIndex) are: %i \n", currentIndex);
        printf("Maximum length of the mapping string is : %i \n", (int)maxLength);
    }

#endif

    fileName[0]=0;
    uprv_strcat(fileName,bundleName);
    /* write the data */
    pData=udata_create(dataDir, DATA_TYPE, fileName, &dataInfo,
                       haveCopyright ? U_COPYRIGHT_STRING : NULL, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: unable to create the output file, error %d\n", errorCode);
        exit(errorCode);
    }

#if !UCONFIG_NO_IDNA

    indexes[_SPREP_INDEX_TRIE_SIZE]=sprepTrieSize;
    indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]=mappingDataCapacity*U_SIZEOF_UCHAR;
    
    udata_writeBlock(pData, indexes, sizeof(indexes));
    udata_writeBlock(pData, sprepTrieBlock, sprepTrieSize);
    udata_writeBlock(pData, mappingData, indexes[_SPREP_INDEX_MAPPING_DATA_SIZE]);
    

#endif

    /* finish up */
    dataLength=udata_finish(pData, &errorCode);
    if(U_FAILURE(errorCode)) {
        fprintf(stderr, "gensprep: error %d writing the output file\n", errorCode);
        exit(errorCode);
    }

    if(dataLength!=size) {
        fprintf(stderr, "gensprep error: data length %ld != calculated size %ld\n",
            (long)dataLength, (long)size);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }

#if !UCONFIG_NO_IDNA
    /* done with writing the data .. close the hashtable */
    if (hashTable != NULL) {
        uhash_close(hashTable);
    }
#endif

    uprv_free(fileName);
}